

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void require_numeric_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *datatype)

{
  MOJOSHADER_astDataTypeType MVar1;
  MOJOSHADER_astDataType *local_18;
  MOJOSHADER_astDataType *datatype_local;
  Context_conflict *ctx_local;
  
  local_18 = reduce_datatype(ctx,datatype);
  if (local_18->type == MOJOSHADER_AST_DATATYPE_VECTOR) {
    local_18 = reduce_datatype(ctx,(local_18->array).base);
  }
  else if (local_18->type == MOJOSHADER_AST_DATATYPE_MATRIX) {
    local_18 = reduce_datatype(ctx,(local_18->array).base);
  }
  MVar1 = local_18->type;
  if ((3 < MVar1 - MOJOSHADER_AST_DATATYPE_BOOL) &&
     (MVar1 != MOJOSHADER_AST_DATATYPE_HALF && MVar1 != MOJOSHADER_AST_DATATYPE_DOUBLE)) {
    fail(ctx,"Expected numeric type");
  }
  return;
}

Assistant:

static void require_numeric_datatype(Context *ctx,
                                     const MOJOSHADER_astDataType *datatype)
{
    datatype = reduce_datatype(ctx, datatype);
    if (datatype->type == MOJOSHADER_AST_DATATYPE_VECTOR)
        datatype = reduce_datatype(ctx, datatype->vector.base);
    else if (datatype->type == MOJOSHADER_AST_DATATYPE_MATRIX)
        datatype = reduce_datatype(ctx, datatype->matrix.base);

    switch (datatype->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
        case MOJOSHADER_AST_DATATYPE_HALF:
        case MOJOSHADER_AST_DATATYPE_FLOAT:
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            return;
        default: break;
    } // switch

    fail(ctx, "Expected numeric type");  // !!! FIXME: fmt.
    // !!! FIXME: replace AST node with an AST_OP_INT_LITERAL zero, keep going.
}